

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_container_is_subset_run(array_container_t *container1,run_container_t *container2)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint32_t stop;
  uint32_t start;
  int i_run;
  int i_array;
  run_container_t *container2_local;
  array_container_t *container1_local;
  
  iVar1 = container1->cardinality;
  iVar3 = run_container_cardinality(container2);
  if (iVar1 <= iVar3) {
    start = 0;
    stop = 0;
    while( true ) {
      bVar2 = false;
      if ((int)start < container1->cardinality) {
        bVar2 = (int)stop < container2->n_runs;
      }
      if (!bVar2) {
        if (start != container1->cardinality) {
          return false;
        }
        return true;
      }
      uVar4 = (uint)container2->runs[(int)stop].value;
      if (container1->array[(int)start] < uVar4) break;
      if (uVar4 + container2->runs[(int)stop].length < (uint)container1->array[(int)start]) {
        stop = stop + 1;
      }
      else {
        start = start + 1;
      }
    }
  }
  return false;
}

Assistant:

bool array_container_is_subset_run(const array_container_t* container1,
                                   const run_container_t* container2) {
    if (container1->cardinality > run_container_cardinality(container2))
        return false;
    int i_array = 0, i_run = 0;
    while (i_array < container1->cardinality && i_run < container2->n_runs) {
        uint32_t start = container2->runs[i_run].value;
        uint32_t stop = start + container2->runs[i_run].length;
        if (container1->array[i_array] < start) {
            return false;
        } else if (container1->array[i_array] > stop) {
            i_run++;
        } else {  // the value of the array is in the run
            i_array++;
        }
    }
    if (i_array == container1->cardinality) {
        return true;
    } else {
        return false;
    }
}